

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O1

void __thiscall Firework::explode(Firework *this)

{
  pointer *ppPVar1;
  iterator __position;
  double dVar2;
  double dVar3;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar4;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aVar5;
  Rng *this_00;
  int iVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_78;
  float fStack_70;
  float fStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  int iStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  double local_38;
  
  this_00 = piksel::Rng::getInstance();
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  iVar6 = 200;
  do {
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    fStack_70 = 0.0;
    fStack_6c = 0.0;
    iStack_5c = 0xffffffff;
    local_58 = 0x3f8000003f800000;
    uStack_50 = 0x3f8000003f800000;
    local_48 = 0x3f800000;
    local_78.field_0 =
         *(anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
           *)&(this->rocket).position.field_0;
    piksel::Rng::random(this_00);
    local_58 = CONCAT44(local_58._4_4_,extraout_XMM0_Da_02);
    piksel::Rng::random(this_00);
    piksel::Rng::random(this_00);
    local_38 = (double)extraout_XMM0_Da_03;
    dVar2 = cos(local_38);
    dVar3 = sin(local_38);
    fStack_70 = (float)(dVar2 * (double)extraout_XMM0_Da_04);
    fStack_6c = (float)(dVar3 * (double)extraout_XMM0_Da_04);
    piksel::Rng::random(this_00);
    iStack_5c = (int)extraout_XMM0_Da_05;
    local_58 = CONCAT44(extraout_XMM0_Da,(undefined4)local_58);
    uStack_50 = CONCAT44(extraout_XMM0_Da_01,extraout_XMM0_Da_00);
    local_48 = 0x3f800000;
    __position._M_current =
         (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Particle,std::allocator<Particle>>::_M_realloc_insert<Particle_const&>
                ((vector<Particle,std::allocator<Particle>> *)&this->particles,__position,
                 (Particle *)&local_78.field_0);
    }
    else {
      ((__position._M_current)->color).field_0.field_0.w = 1.0;
      aVar4.field_0.y = fStack_6c;
      aVar4.field_0.x = fStack_70;
      aVar5.field_0.y = (float)uStack_64;
      aVar5.field_0.x = (float)uStack_68;
      *(undefined8 *)&(__position._M_current)->mass = local_58;
      *(undefined8 *)((long)&((__position._M_current)->color).field_0 + 4) = uStack_50;
      ((__position._M_current)->acceleration).field_0 = aVar5;
      (__position._M_current)->age = uStack_60;
      (__position._M_current)->lifespan = iStack_5c;
      ((__position._M_current)->position).field_0 = local_78;
      ((__position._M_current)->velocity).field_0 = aVar4;
      ppPVar1 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  this->exploded = true;
  return;
}

Assistant:

void Firework::explode() {
    piksel::Rng& rng = piksel::Rng::getInstance();
    glm::vec4 color = glm::vec4(rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), 1.0f);
    for (int i = 0; i < 200; i++) {
        Particle particle;
        particle.position = rocket.position;
        particle.mass = rng.random(0.7, 1.0);
        float angle = rng.random(0.0, piksel::TWO_PI);
        float magnitude = rng.random(2.0f, 10.0f);
        particle.velocity = glm::vec2(magnitude * cos(angle), magnitude * sin(angle));
        particle.lifespan = rng.random(90.0f, 110.0f);
        particle.color = color;
        particles.push_back(particle);
    }
    exploded = true;
}